

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> * __thiscall
VulkanUtilities::VulkanLogicalDevice::
CreateVulkanObject<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2,VkResult(*)(VkDevice_T*,VkBufferCreateInfo_const*,VkAllocationCallbacks_const*,VkBuffer_T**),VkBufferCreateInfo>
          (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>
           *__return_storage_ptr__,VulkanLogicalDevice *this,
          _func_VkResult_VkDevice_T_ptr_VkBufferCreateInfo_ptr_VkAllocationCallbacks_ptr_VkBuffer_T_ptr_ptr
          *VkCreateObject,VkBufferCreateInfo *CreateInfo,char *DebugName,char *ObjectType)

{
  VkResult errorCode;
  char *name;
  char local_51;
  VkBuffer_T *VkObject;
  char *DebugName_local;
  char *ObjectType_local;
  __shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> local_38;
  char *local_28;
  
  DebugName_local = DebugName;
  if (DebugName == (char *)0x0) {
    DebugName_local = "";
  }
  name = DebugName_local;
  VkObject = (VkBuffer_T *)0x0;
  ObjectType_local = ObjectType;
  errorCode = (*VkCreateObject)(this->m_VkDevice,CreateInfo,this->m_VkAllocator,&VkObject);
  if (errorCode != VK_SUCCESS) {
    local_51 = '\'';
    local_28 = VkResultToString(errorCode);
    Diligent::LogError<true,char[25],char_const*,char[3],char_const*,char,char[17],char_const*>
              (false,"CreateVulkanObject",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0xad,(char (*) [25])"Failed to create Vulkan ",&ObjectType_local,
               (char (*) [3])0x5abda8,&DebugName_local,&local_51,(char (*) [17])"\nVK Error Code: ",
               &local_28);
    name = DebugName_local;
  }
  if (*name != '\0') {
    SetVulkanObjectName<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>
              (this->m_VkDevice,VkObject,name);
  }
  std::__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<VulkanUtilities::VulkanLogicalDevice,void>
            ((__shared_ptr<VulkanUtilities::VulkanLogicalDevice_const,(__gnu_cxx::_Lock_policy)2> *)
             &local_38,
             (__weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                *)__return_storage_ptr__,&local_38);
  __return_storage_ptr__->m_VkObject = VkObject;
  VkObject = (VkBuffer_T *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

VulkanObjectWrapper<VkObjectType, VkTypeId> VulkanLogicalDevice::CreateVulkanObject(VkCreateObjectFuncType        VkCreateObject,
                                                                                    const VkObjectCreateInfoType& CreateInfo,
                                                                                    const char*                   DebugName,
                                                                                    const char*                   ObjectType) const
{
    if (DebugName == nullptr)
        DebugName = "";

    VkObjectType VkObject = VK_NULL_HANDLE;

    VkResult err = VkCreateObject(m_VkDevice, &CreateInfo, m_VkAllocator, &VkObject);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan ", ObjectType, " '", DebugName, '\'');

    if (*DebugName != 0)
        SetVulkanObjectName<VkObjectType, VkTypeId>(m_VkDevice, VkObject, DebugName);

    return VulkanObjectWrapper<VkObjectType, VkTypeId>{GetSharedPtr(), std::move(VkObject)};
}